

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

void __thiscall HinOut::setData(HinOut *this,HModel *ptr_model)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->super_HPreData).numCol;
  ptr_model->numCol = iVar1;
  iVar2 = (this->super_HPreData).numRow;
  ptr_model->numRow = iVar2;
  ptr_model->numTot = iVar2 + iVar1;
  std::vector<int,_std::allocator<int>_>::operator=
            (&ptr_model->Astart,&(this->super_HPreData).Astart);
  std::vector<int,_std::allocator<int>_>::operator=
            (&ptr_model->Aindex,&(this->super_HPreData).Aindex);
  std::vector<double,_std::allocator<double>_>::operator=
            (&ptr_model->Avalue,&(this->super_HPreData).Avalue);
  std::vector<double,_std::allocator<double>_>::operator=
            (&ptr_model->colCost,&(this->super_HPreData).colCost);
  std::vector<double,_std::allocator<double>_>::operator=
            (&ptr_model->colLower,&(this->super_HPreData).colLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&ptr_model->colUpper,&(this->super_HPreData).colUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&ptr_model->rowLower,&(this->super_HPreData).rowLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&ptr_model->rowUpper,&(this->super_HPreData).rowUpper);
  return;
}

Assistant:

void HinOut::setData(HModel & ptr_model) {
	ptr_model.numCol = numCol;
    ptr_model.numRow = numRow;
    ptr_model.numTot = numCol + numRow;
    ptr_model.Astart = Astart;
    ptr_model.Aindex = Aindex;
    ptr_model.Avalue = Avalue;
    ptr_model.colCost = colCost;
    ptr_model.colLower = colLower;
    ptr_model.colUpper = colUpper;
    ptr_model.rowLower = rowLower;
    ptr_model.rowUpper = rowUpper;
}